

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  long *plVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  Chunk *pCVar5;
  void *pvVar6;
  string *psVar7;
  ulong uVar8;
  long *plVar9;
  AllocationPolicy *policy;
  size_t size;
  long *plVar10;
  code *pcVar11;
  long *plVar12;
  bool bVar13;
  SizedPtr SVar14;
  long alStack_38 [2];
  
  plVar9 = alStack_38;
  if (this->next_ == this->limit_) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (this->next_,this->limit_,"next_ == limit_");
  }
  if (psVar7 == (string *)0x0) {
    policy = (AllocationPolicy *)((arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8);
    if (this->head_ == (Chunk *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = this->head_->size;
    }
    uVar8 = 0x1000;
    if (sVar3 * 2 < 0x1000) {
      uVar8 = sVar3 * 2;
    }
    size = 0x40;
    if (sVar3 != 0) {
      size = uVar8;
    }
    if (policy == (AllocationPolicy *)0x0) {
      lVar4 = __tls_get_addr(&PTR_001b9e58);
      if (*(code **)(lVar4 + 0x20) == (code *)0x0) {
        pvVar6 = operator_new(size);
        SVar14.n = size;
        SVar14.p = pvVar6;
      }
      else {
        SVar14 = (SizedPtr)(**(code **)(lVar4 + 0x20))(size,*(undefined8 *)(lVar4 + 0x28));
      }
    }
    else {
      SVar14 = anon_unknown_12::AllocateMemory(policy,size);
    }
    sVar3 = SVar14.n;
    pCVar5 = (Chunk *)SVar14.p;
    (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar3;
    pCVar5->next = this->head_;
    pCVar5->size = sVar3;
    this->head_ = pCVar5;
    this->prefetch_ptr_ = (char *)(pCVar5 + 1);
    this->limit_ = (CleanupNode *)((long)&pCVar5[1].next + (sVar3 - 0x10 & 0xfffffffffffffff0));
    this->next_ = (CleanupNode *)(pCVar5 + 2);
    pCVar5[1].next = (Chunk *)elem;
    pCVar5[1].size = (size_t)destructor;
    return;
  }
  AddFallback();
  if ((long *)*plVar9 == (long *)0x0) {
    return;
  }
  uVar8 = *(ulong *)(*(long *)(psVar7 + 0x60) + 8) & 0xfffffffffffffff8;
  if (uVar8 == 0) {
    pcVar11 = (code *)0x0;
  }
  else {
    pcVar11 = *(code **)(uVar8 + 0x18);
  }
  plVar12 = (long *)(plVar9[1] + -0x10);
  plVar9 = (long *)*plVar9;
  do {
    plVar1 = plVar9 + 2;
    plVar10 = plVar12;
    if (plVar1 <= plVar12) {
      uVar2 = 0;
      do {
        plVar10 = plVar10 + -2;
        if (plVar10 < plVar1) break;
        bVar13 = uVar2 < 7;
        uVar2 = uVar2 + 1;
      } while (bVar13);
    }
    for (; plVar1 <= plVar10; plVar10 = plVar10 + -2) {
      (*(code *)plVar12[1])(*plVar12);
      plVar12 = plVar12 + -2;
    }
    for (; plVar1 <= plVar12; plVar12 = plVar12 + -2) {
      (*(code *)plVar12[1])(*plVar12);
    }
    plVar1 = (long *)*plVar9;
    if (pcVar11 == (code *)0x0) {
      operator_delete(plVar9,plVar9[1]);
    }
    else {
      (*pcVar11)();
    }
    if (plVar1 == (long *)0x0) {
      return;
    }
    plVar12 = (long *)((plVar1[1] - 0x10U & 0xfffffffffffffff0) + (long)plVar1);
    plVar9 = plVar1;
  } while( true );
}

Assistant:

void ChunkList::AddFallback(void* elem, void (*destructor)(void*),
                            SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}